

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::TermPass0
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,int depth)

{
  EncodedChar *location;
  code *pcVar1;
  bool bVar2;
  EncodedChar EVar3;
  Char CVar4;
  uint uVar5;
  CharCount CVar6;
  CharCount CVar7;
  ThreadContext *this_00;
  ScriptConfiguration *this_01;
  undefined4 *puVar8;
  bool bVar9;
  CharCount upper;
  CharCount lower;
  Char c;
  EncodedChar *current;
  bool clearLocationIfPresent;
  int depth_local;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this_local;
  
  this_00 = Js::ScriptContext::GetThreadContext(this->scriptContext);
  ThreadContext::ProbeStackNoDispose(this_00,0x6000,this->scriptContext,(PVOID)0x0);
  bVar9 = this->tempLocationOfSurrogatePair != (EncodedChar *)0x0;
  EVar3 = ECLookahead(this,0);
  switch(EVar3) {
  case L'\0':
    bVar2 = IsEOF(this);
    if (bVar2) {
      Fail(this,-0x7ff5ec67);
    }
  default:
    location = this->next;
    CVar4 = NextChar(this);
    this_01 = Js::ScriptContext::GetConfig(this->scriptContext);
    bVar2 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_01);
    if (bVar2) {
      TrackIfSurrogatePair
                (this,(uint)(ushort)CVar4,location,(uint32)((long)this->next - (long)location >> 1))
      ;
    }
    if (CVar4 == L'/') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x4e7,"(!IsLiteral || c != \'/\')","!IsLiteral || c != \'/\'");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    break;
  case L'$':
  case L'^':
    ECConsume(this,1);
    return;
  case L'(':
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    this->codePointAtTempLocation = 0;
    bVar9 = false;
    ECConsume(this,1);
    EVar3 = ECLookahead(this,0);
    if (EVar3 == L'?') {
      bVar2 = ECCanConsume(this,2);
      if (!bVar2) {
        Fail(this,-0x7ff5ec67);
      }
      EVar3 = ECLookahead(this,1);
      if (((EVar3 == L'!') || (EVar3 == L':')) || (EVar3 == L'=')) {
        ECConsume(this,2);
      }
      else {
        this->numGroups = this->numGroups + 1;
      }
    }
    else {
      this->numGroups = this->numGroups + 1;
    }
    DisjunctionPass0(this,depth + 1);
    ECMust(this,L')',-0x7ff5ec64);
    break;
  case L')':
  case L'|':
    Fail(this,-0x7ff5ec67);
    break;
  case L'*':
  case L'+':
  case L'?':
  case L'{':
    bVar2 = AtQuantifier(this);
    if (bVar2) {
      Fail(this,-0x7ff5ec66);
    }
    else {
      ECConsume(this,1);
    }
    break;
  case L'.':
    ECConsume(this,1);
    break;
  case L'[':
    ECConsume(this,1);
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    this->codePointAtTempLocation = 0;
    this->tempLocationOfRange = this->next;
    CharacterClassPass0(this);
    this->tempLocationOfRange = (EncodedChar *)0x0;
    ECMust(this,L']',-0x7ff5ec65);
    break;
  case L'\\':
    ECConsume(this,1);
    bVar2 = AtomEscapePass0(this);
    if (bVar2) {
      return;
    }
    break;
  case L']':
  case L'}':
    NextChar(this);
  }
  if ((bVar9) && (this->tempLocationOfSurrogatePair != (EncodedChar *)0x0)) {
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    this->codePointAtTempLocation = 0;
  }
  bVar9 = AtQuantifier(this);
  if (bVar9) {
    EVar3 = ECLookahead(this,0);
    uVar5 = (uint)(ushort)EVar3;
    if ((uVar5 - 0x2a < 2) || (uVar5 == 0x3f)) {
      ECConsume(this,1);
      OptNonGreedy(this);
    }
    else if (uVar5 == 0x7b) {
      ECConsume(this,1);
      CVar6 = RepeatCount(this);
      EVar3 = ECLookahead(this,0);
      if (EVar3 == L',') {
        ECConsume(this,1);
        EVar3 = ECLookahead(this,0);
        if (EVar3 == L'}') {
          ECConsume(this,1);
          OptNonGreedy(this);
        }
        else {
          CVar7 = RepeatCount(this);
          if (CVar7 < CVar6) {
            Fail(this,-0x7ff5ec67);
          }
          EVar3 = ECLookahead(this,0);
          if (EVar3 != L'}') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x50e,"(ECLookahead() == \'}\')","ECLookahead() == \'}\'");
            if (!bVar9) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          ECConsume(this,1);
          OptNonGreedy(this);
        }
      }
      else if (EVar3 == L'}') {
        ECConsume(this,1);
        OptNonGreedy(this);
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x518,"(false)","false");
        if (!bVar9) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x51e,"(false)","false");
      if (!bVar9) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::TermPass0(int depth)
    {
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackRegex);
        // Either we have a location at the start, or the end, never both. As in between it should have been cleared if surrogate pair
        // Or must be cleared if we didn't perform the check
        bool clearLocationIfPresent = this->tempLocationOfSurrogatePair != nullptr;

        switch (ECLookahead())
        {
        case '^':
        case '$':
            ECConsume();
            return;
        case '\\':
            ECConsume();
            if (AtomEscapePass0())
                return;
            break;
        case '(':
            // Can't combine into a single codeunit because of group present
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
            clearLocationIfPresent = false;
            ECConsume();
            switch (ECLookahead())
            {
            case '?':
                if (!ECCanConsume(2))
                    Fail(JSERR_RegExpSyntax);
                switch (ECLookahead(1))
                {
                case '=':
                case '!':
                case ':':
                    ECConsume(2);
                    break;
                default:
                    numGroups++;
                    break;
                }
                break;
            default:
                numGroups++;
                break;
            }
            DisjunctionPass0(depth + 1);
            ECMust(')', JSERR_RegExpNoParen);
            break;
        case '.':
            ECConsume();
            break;
        case '[':
            ECConsume();
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
            this->tempLocationOfRange = next;
            CharacterClassPass0();
            this->tempLocationOfRange = nullptr;
            ECMust(']', JSERR_RegExpNoBracket);
            break;
        case ')':
        case '|':
            Fail(JSERR_RegExpSyntax);
            break;
        case ']':
        case '}':
            NextChar();
            break;
        case '*':
        case '+':
        case '?':
        case '{':
            if (AtQuantifier())
                Fail(JSERR_RegExpBadQuant);
            else
                ECConsume();
            break;
        case 0:
            if (IsEOF())
                // Terminating 0
                Fail(JSERR_RegExpSyntax);
            // else fall-through for embedded 0
        default:
            {
                const EncodedChar* current = next;
                Char c = NextChar();
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    TrackIfSurrogatePair(c, current, (uint32)(next - current));
                }
                // Closing '/' in literals should be caught explicitly
                Assert(!IsLiteral || c != '/');
            }
            break;
        }

        if (clearLocationIfPresent && this->tempLocationOfSurrogatePair != nullptr)
        {
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
        }

        if (AtQuantifier())
        {
            switch (ECLookahead())
            {
            case '*':
            case '+':
            case '?':
                ECConsume();
                OptNonGreedy();
                break;
            case '{':
                {
                    ECConsume();
                    CharCount lower = RepeatCount();
                    switch (ECLookahead())
                    {
                    case ',':
                        ECConsume();
                        if (ECLookahead() == '}')
                        {
                            ECConsume();
                            OptNonGreedy();
                        }
                        else
                        {
                            CharCount upper = RepeatCount();
                            if (upper < lower)
                                Fail(JSERR_RegExpSyntax);
                            Assert(ECLookahead() == '}');
                            ECConsume();
                            OptNonGreedy();
                        }
                        break;
                    case '}':
                        ECConsume();
                        OptNonGreedy();
                        break;
                    default:
                        Assert(false);
                        break;
                    }
                    break;
                }
            default:
                Assert(false);
                break;
            }
        }
    }